

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestConsole.cpp
# Opt level: O0

void testConsole(void)

{
  undefined8 local_4e30;
  usize bufferSize;
  char buffer [20000];
  
  Console::printf("%s\n","Hello world");
  local_4e30 = 19999;
  Memory::fill(&bufferSize,'a',0x4e1e);
  *(undefined1 *)((long)&local_4e30 + local_4e30 + 6) = 0x62;
  *(undefined1 *)((long)&local_4e30 + local_4e30 + 7) = 0;
  Console::printf("%hs%hs\n",&bufferSize,&bufferSize);
  return;
}

Assistant:

void testConsole()
{
  // test printf
  {
    Console::printf("%s\n", "Hello world");
    char buffer[5000 * 4];
    usize bufferSize = sizeof(buffer) - 1;
    Memory::fill(buffer, 'a', bufferSize - 1);
    buffer[bufferSize - 2] = 'b';
    buffer[bufferSize - 1] = '\0';
    Console::printf("%hs%hs\n", buffer, buffer);
  }
}